

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element_position_bitmask_table.hpp
# Opt level: O0

void __thiscall
burst::algorithm::detail::
element_position_bitmask_table<std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
::initialize<std::_Fwd_list_const_iterator<int>>
          (element_position_bitmask_table<std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
           *this,_Fwd_list_const_iterator<int> first,_Fwd_list_const_iterator<int> last)

{
  bool bVar1;
  reference __k;
  mapped_type *this_00;
  _Base_bitset<1UL> local_30;
  bitmask_type position_indicator;
  size_t elements_count;
  element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
  *this_local;
  _Fwd_list_const_iterator<int> last_local;
  _Fwd_list_const_iterator<int> first_local;
  
  position_indicator.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  this_local = (element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
                *)last._M_node;
  last_local = first;
  std::bitset<32UL>::bitset((bitset<32UL> *)&local_30,1);
  while( true ) {
    bVar1 = std::operator!=(&last_local,(_Self *)&this_local);
    if (!bVar1) break;
    __k = std::_Fwd_list_const_iterator<int>::operator*(&last_local);
    this_00 = std::
              map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>
              ::operator[]((map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>
                            *)this,__k);
    std::bitset<32UL>::operator|=(this_00,(bitset<32UL> *)&local_30);
    std::_Fwd_list_const_iterator<int>::operator++(&last_local);
    local_30._M_w = (_WordT)left_shift<std::bitset<32ul>,unsigned_int>(local_30._M_w,1);
    position_indicator.super__Base_bitset<1UL>._M_w =
         (_Base_bitset<1UL>)((long)position_indicator.super__Base_bitset<1UL>._M_w + 1);
  }
  *(_Base_bitset<1UL> *)(this + 0x30) = position_indicator.super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

void initialize (InputIterator first, InputIterator last)
                {
                    using iterated_type = iterator_value_t<InputIterator>;
                    static_assert(std::is_same<iterated_type, key_type>::value,
                        "Неверно задан тип входного элемента.");

                    auto elements_count = std::size_t{0};

                    auto position_indicator = bitmask_type{0b1};
                    while (first != last)
                    {
                        m_bitmasks[*first] |= position_indicator;

                        ++first;
                        position_indicator = left_shift(position_indicator, 1u);
                        ++elements_count;
                    }

                    m_sequence_length = elements_count;
                }